

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O3

void __thiscall
helics::FilterFederate::processDestFilterReturn(FilterFederate *this,ActionMessage *command)

{
  uint32_t pid;
  GlobalFederateId fid;
  BasicHandleInfo *handle;
  mapped_type *pmVar1;
  _Rb_tree_header *p_Var2;
  FilterCoordinator *fcoord;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  BaseType local_2c;
  
  handle = HandleManager::getInterfaceHandle
                     (this->mHandles,(InterfaceHandle)(command->dest_handle).hid,ENDPOINT);
  if (handle != (BasicHandleInfo *)0x0) {
    pid = command->sequenceID;
    fid.gid = (handle->handle).fed_id.gid;
    local_2c = fid.gid;
    pmVar1 = std::
             map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
             ::operator[](&this->ongoingDestFilterProcesses,&local_2c);
    p_Var3 = (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var3 != (_Base_ptr)0x0) {
      p_Var2 = &(pmVar1->_M_t)._M_impl.super__Rb_tree_header;
      p_Var4 = &p_Var2->_M_header;
      do {
        if ((int)pid <= (int)p_Var3[1]._M_color) {
          p_Var4 = p_Var3;
        }
        p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < (int)pid];
      } while (p_Var3 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var4 != p_Var2) && ((int)p_Var4[1]._M_color <= (int)pid)) {
        if (command->messageAction != cmd_null_dest_message) {
          fcoord = getFilterCoordinator(this,(InterfaceHandle)(handle->handle).handle.hid);
          if ((fcoord->cloningDestFilters).
              super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              (fcoord->cloningDestFilters).
              super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            runCloningDestinationFilters(this,fcoord,handle,command);
          }
          ActionMessage::setAction(command,cmd_send_message);
          if ((this->mSendMessageMove).super__Function_base._M_manager == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          (*(this->mSendMessageMove)._M_invoker)((_Any_data *)&this->mSendMessageMove,command);
        }
        acceptDestProcessReturn(this,fid,pid);
      }
    }
  }
  return;
}

Assistant:

void FilterFederate::processDestFilterReturn(ActionMessage& command)
{
    {
        auto* handle = mHandles->getInterfaceHandle(command.dest_handle, InterfaceType::ENDPOINT);
        if (handle == nullptr) {
            return;
        }
        auto mid = command.sequenceID;
        auto fid = handle->getFederateId();

        auto& ongoingDestProcess = ongoingDestFilterProcesses[fid.baseValue()];
        if (ongoingDestProcess.find(mid) != ongoingDestProcess.end()) {
            if (command.action() == CMD_NULL_DEST_MESSAGE) {
                acceptDestProcessReturn(fid, mid);
                return;
            }
            auto* filtFunc = getFilterCoordinator(handle->getInterfaceHandle());

            if (!filtFunc->cloningDestFilters.empty()) {
                runCloningDestinationFilters(filtFunc, handle, command);
            }

            // mCoord->processTimeMessage(command);
            command.setAction(CMD_SEND_MESSAGE);
            mSendMessageMove(std::move(command));
            acceptDestProcessReturn(fid, mid);
        }
    }
}